

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

error_code __thiscall
llvm::sys::fs::createTemporaryFile
          (fs *this,Twine *Prefix,StringRef Suffix,SmallVectorImpl<char> *ResultPath)

{
  undefined8 in_RAX;
  StringRef Suffix_00;
  error_code eVar1;
  int FD;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  Suffix_00.Length = Suffix.Data;
  Suffix_00.Data = (char *)Prefix;
  eVar1 = createTemporaryFile((Twine *)this,Suffix_00,&local_14,
                              (SmallVectorImpl<char> *)Suffix.Length);
  if (eVar1._M_value == 0) {
    close(local_14);
  }
  eVar1._4_4_ = 0;
  return eVar1;
}

Assistant:

std::error_code createTemporaryFile(const Twine &Prefix, StringRef Suffix,
                                    SmallVectorImpl<char> &ResultPath) {
  int FD;
  auto EC = createTemporaryFile(Prefix, Suffix, FD, ResultPath);
  if (EC)
    return EC;
  // FD is only needed to avoid race conditions. Close it right away.
  close(FD);
  return EC;
}